

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

upb_value * inttable_val(upb_inttable *t,uintptr_t key)

{
  uint32_t hash;
  lookupkey_t key_00;
  upb_inttable *local_48;
  upb_tabent *e;
  uintptr_t key_local;
  upb_inttable *t_local;
  
  if (key < t->array_size) {
    t_local = (upb_inttable *)inttable_array_get(t,key);
  }
  else {
    key_00 = intkey(key);
    hash = upb_inthash(key);
    local_48 = (upb_inttable *)findentry_mutable(&t->t,key_00,hash,inteql);
    if (local_48 == (upb_inttable *)0x0) {
      local_48 = (upb_inttable *)0x0;
    }
    t_local = local_48;
  }
  return (upb_value *)t_local;
}

Assistant:

static upb_value* inttable_val(upb_inttable* t, uintptr_t key) {
  if (key < t->array_size) {
    return (upb_value*)inttable_array_get(t, key);
  } else {
    upb_tabent* e =
        findentry_mutable(&t->t, intkey(key), upb_inthash(key), &inteql);
    return e ? &e->val : NULL;
  }
}